

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrack.cc
# Opt level: O3

bool __thiscall
re2::Backtracker::Search
          (Backtracker *this,StringPiece *text,StringPiece *context,bool anchored,bool longest,
          StringPiece *submatch,int nsubmatch)

{
  bool bVar1;
  int iVar2;
  Prog *pPVar3;
  bool bVar4;
  int iVar5;
  uint32 *__s;
  int iVar6;
  ulong uVar7;
  size_t __n;
  char *pcVar8;
  LogMessage local_1b0;
  
  (this->text_).length_ = text->length_;
  (this->text_).ptr_ = text->ptr_;
  pcVar8 = context->ptr_;
  (this->context_).ptr_ = pcVar8;
  (this->context_).length_ = context->length_;
  if (pcVar8 == (char *)0x0) {
    (this->context_).length_ = text->length_;
    (this->context_).ptr_ = text->ptr_;
  }
  bVar4 = this->prog_->anchor_start_;
  if (((bVar4 != true) || (text->ptr_ <= (this->context_).ptr_)) &&
     ((bVar1 = this->prog_->anchor_end_, bVar1 != true ||
      ((this->context_).ptr_ + (this->context_).length_ <= text->ptr_ + text->length_)))) {
    this->anchored_ = (bool)(bVar4 | anchored);
    this->longest_ = (bool)(longest | bVar1);
    this->endmatch_ = bVar1;
    this->submatch_ = submatch;
    this->nsubmatch_ = nsubmatch;
    if (nsubmatch < 0x20) {
      memset(this->cap_,0,0x200);
      if (nsubmatch < 1) {
        submatch = (StringPiece *)&local_1b0;
        this->submatch_ = submatch;
        this->nsubmatch_ = 1;
      }
    }
    else {
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/backtrack.cc"
                 ,0x72,3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0.str_,"Check failed: 2*nsubmatch_ < arraysize(cap_)",0x2c);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
      memset(this->cap_,0,0x200);
      submatch = this->submatch_;
    }
    local_1b0.str_ = (ostringstream)0x0;
    local_1b0._9_3_ = 0;
    local_1b0.severity_ = 0;
    local_1b0.flushed_ = false;
    local_1b0._5_3_ = 0;
    ((LogMessage *)submatch)->severity_ = 0;
    ((LogMessage *)submatch)->flushed_ = false;
    *(undefined3 *)&((LogMessage *)submatch)->field_0x5 = 0;
    *(undefined4 *)&((LogMessage *)submatch)->str_ = 0;
    if (this->visited_ != (uint32 *)0x0) {
      operator_delete__(this->visited_);
    }
    pPVar3 = this->prog_;
    iVar2 = text->length_;
    iVar5 = (iVar2 + 1) * pPVar3->size_;
    iVar6 = iVar5 + 0x3e;
    if (-1 < iVar5 + 0x1f) {
      iVar6 = iVar5 + 0x1f;
    }
    this->nvisited_ = (long)(iVar6 >> 5);
    __n = (long)(iVar6 >> 5) << 2;
    uVar7 = 0xffffffffffffffff;
    if (-0x3f < iVar5) {
      uVar7 = __n;
    }
    __s = (uint32 *)operator_new__(uVar7);
    this->visited_ = __s;
    memset(__s,0,__n);
    if (this->anchored_ == true) {
      pcVar8 = text->ptr_;
      this->cap_[0] = pcVar8;
      bVar4 = Visit(this,pPVar3->start_,pcVar8);
      return bVar4;
    }
    if (-1 < iVar2) {
      pcVar8 = text->ptr_;
      do {
        this->cap_[0] = pcVar8;
        bVar4 = Visit(this,this->prog_->start_,pcVar8);
        if (bVar4) {
          return bVar4;
        }
        pcVar8 = pcVar8 + 1;
      } while (pcVar8 <= text->ptr_ + text->length_);
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool Backtracker::Search(const StringPiece& text, const StringPiece& context,
                         bool anchored, bool longest,
                         StringPiece* submatch, int nsubmatch) {
  text_ = text;
  context_ = context;
  if (context_.begin() == NULL)
    context_ = text;
  if (prog_->anchor_start() && text.begin() > context_.begin())
    return false;
  if (prog_->anchor_end() && text.end() < context_.end())
    return false;
  anchored_ = anchored | prog_->anchor_start();
  longest_ = longest | prog_->anchor_end();
  endmatch_ = prog_->anchor_end();
  submatch_ = submatch;
  nsubmatch_ = nsubmatch;
  CHECK(2*nsubmatch_ < arraysize(cap_));
  memset(cap_, 0, sizeof cap_);

  // We use submatch_[0] for our own bookkeeping,
  // so it had better exist.
  StringPiece sp0;
  if (nsubmatch < 1) {
    submatch_ = &sp0;
    nsubmatch_ = 1;
  }
  submatch_[0] = NULL;

  // Allocate new visited_ bitmap -- size is proportional
  // to text, so have to reallocate on each call to Search.
  delete[] visited_;
  nvisited_ = (prog_->size()*(text.size()+1) + 31)/32;
  visited_ = new uint32[nvisited_];
  memset(visited_, 0, nvisited_*sizeof visited_[0]);

  // Anchored search must start at text.begin().
  if (anchored_) {
    cap_[0] = text.begin();
    return Visit(prog_->start(), text.begin());
  }

  // Unanchored search, starting from each possible text position.
  // Notice that we have to try the empty string at the end of
  // the text, so the loop condition is p <= text.end(), not p < text.end().
  for (const char* p = text.begin(); p <= text.end(); p++) {
    cap_[0] = p;
    if (Visit(prog_->start(), p))  // Match must be leftmost; done.
      return true;
  }
  return false;
}